

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoli.c
# Opt level: O1

int ffp3di(fitsfile *fptr,long group,LONGLONG ncols,LONGLONG nrows,LONGLONG naxis1,LONGLONG naxis2,
          LONGLONG naxis3,short *array,int *status)

{
  int iVar1;
  long lVar2;
  LONGLONG firstrow;
  long firstelem;
  long lVar3;
  short *array_00;
  LONGLONG LVar4;
  long fpixel [3];
  long lpixel [3];
  long local_68 [4];
  LONGLONG local_48;
  LONGLONG local_40;
  LONGLONG local_38;
  
  local_68[0] = 1;
  local_68[1] = 1;
  local_68[2] = 1;
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 == 0) {
    firstrow = 1;
    if (1 < group) {
      firstrow = group;
    }
    if (nrows != naxis2 || ncols != naxis1) {
      if (nrows < naxis2 || ncols < naxis1) {
        *status = 0x140;
        return 0x140;
      }
      if (0 < naxis3) {
        firstelem = 1;
        lVar3 = 0;
        lVar2 = 0;
        do {
          if (0 < naxis2) {
            array_00 = array + lVar3;
            LVar4 = naxis2;
            do {
              iVar1 = ffpcli(fptr,2,firstrow,firstelem,naxis1,array_00,status);
              if (0 < iVar1) goto LAB_0019906b;
              firstelem = firstelem + naxis1;
              lVar3 = lVar3 + ncols;
              array_00 = array_00 + ncols;
              LVar4 = LVar4 + -1;
            } while (LVar4 != 0);
          }
          lVar3 = lVar3 + (nrows - naxis2) * ncols;
          lVar2 = lVar2 + 1;
        } while (lVar2 != naxis3);
      }
LAB_0019906b:
      return *status;
    }
    ffpcli(fptr,2,firstrow,1,naxis2 * naxis1 * naxis3,array,status);
  }
  else {
    local_38 = naxis3;
    local_48 = ncols;
    local_40 = nrows;
    fits_write_compressed_img(fptr,0x15,local_68,&local_48,0,array,(void *)0x0,status);
  }
  return *status;
}

Assistant:

int ffp3di(fitsfile *fptr,   /* I - FITS file pointer                     */
           long  group,      /* I - group to write(1 = 1st group)         */
           LONGLONG  ncols,      /* I - number of pixels in each row of array */
           LONGLONG  nrows,      /* I - number of rows in each plane of array */
           LONGLONG  naxis1,     /* I - FITS image NAXIS1 value               */
           LONGLONG  naxis2,     /* I - FITS image NAXIS2 value               */
           LONGLONG  naxis3,     /* I - FITS image NAXIS3 value               */
           short *array,     /* I - array to be written                   */
           int  *status)     /* IO - error status                         */
/*
  Write an entire 3-D cube of values to the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of the
  FITS array is not the same as the array being written).
*/
{
    long tablerow, ii, jj;
    long fpixel[3]= {1,1,1}, lpixel[3];
    LONGLONG nfits, narray;
    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */
           
    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */
        lpixel[0] = (long) ncols;
        lpixel[1] = (long) nrows;
        lpixel[2] = (long) naxis3;
       
        fits_write_compressed_img(fptr, TSHORT, fpixel, lpixel,
            0,  array, NULL, status);
    
        return(*status);
    }

    tablerow=maxvalue(1,group);

    if (ncols == naxis1 && nrows == naxis2)  /* arrays have same size? */
    {
      /* all the image pixels are contiguous, so write all at once */
      ffpcli(fptr, 2, tablerow, 1L, naxis1 * naxis2 * naxis3, array, status);
      return(*status);
    }

    if (ncols < naxis1 || nrows < naxis2)
       return(*status = BAD_DIMEN);

    nfits = 1;   /* next pixel in FITS image to write to */
    narray = 0;  /* next pixel in input array to be written */

    /* loop over naxis3 planes in the data cube */
    for (jj = 0; jj < naxis3; jj++)
    {
      /* loop over the naxis2 rows in the FITS image, */
      /* writing naxis1 pixels to each row            */

      for (ii = 0; ii < naxis2; ii++)
      {
       if (ffpcli(fptr, 2, tablerow, nfits, naxis1,&array[narray],status) > 0)
         return(*status);

       nfits += naxis1;
       narray += ncols;
      }
      narray += (nrows - naxis2) * ncols;
    }
    return(*status);
}